

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O0

void __thiscall SignedShort_Signed_Test::TestBody(SignedShort_Signed_Test *this)

{
  ParamType_conflict *pPVar1;
  ScopedTrace local_11;
  SignedShort_Signed_Test *pSStack_10;
  ScopedTrace gtest_trace_247;
  SignedShort_Signed_Test *this_local;
  
  pSStack_10 = this;
  testing::ScopedTrace::ScopedTrace
            (&local_11,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
             ,0xf7,"SignedShort");
  pPVar1 = testing::WithParamInterface<short>::GetParam();
  anon_unknown.dwarf_131826::check<short>(*pPVar1);
  testing::ScopedTrace::~ScopedTrace(&local_11);
  return;
}

Assistant:

TEST_P (SignedShort, Signed) {
    SCOPED_TRACE ("SignedShort");
    check (GetParam ());
}